

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O0

bool __thiscall SampleMuxerMetadata::AddChapter(SampleMuxerMetadata *this,cue_t *cue)

{
  bool bVar1;
  Chapter *this_00;
  ulong uVar2;
  char *pcVar3;
  presentation_t pVar4;
  presentation_t pVar5;
  reference pbVar6;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string local_80 [8];
  string title;
  _Self local_60;
  iter_t j;
  iter_t i;
  uint64_t stop_time_ns;
  uint64_t start_time_ns;
  time_ms_t stop_time_ms;
  time_ms_t start_time_ms;
  char *id;
  Chapter *chapter;
  cue_t *cue_local;
  SampleMuxerMetadata *this_local;
  
  this_00 = mkvmuxer::Segment::AddChapter(this->segment_);
  if (this_00 == (Chapter *)0x0) {
    printf("Unable to add chapter\n");
    this_local._7_1_ = false;
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = mkvmuxer::Chapter::set_id(this_00,pcVar3);
      if (!bVar1) {
        printf("Unable to set chapter id\n");
        return false;
      }
    }
    else {
      mkvmuxer::Chapter::set_id(this_00,(char *)0x0);
    }
    pVar4 = libwebvtt::Time::presentation(&cue->start_time);
    pVar5 = libwebvtt::Time::presentation(&cue->stop_time);
    mkvmuxer::Chapter::set_time(this_00,this->segment_,pVar4 * 1000000,pVar5 * 1000000);
    j._M_node = (_List_node_base *)
                std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&cue->payload);
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&cue->payload);
    std::__cxx11::string::string(local_80);
    while( true ) {
      local_88._M_node =
           (_List_node_base *)
           std::
           _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator++(&j,0);
      pbVar6 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_88);
      std::__cxx11::string::operator+=(local_80,(string *)pbVar6);
      bVar1 = std::operator==(&j,&local_60);
      if (bVar1) break;
      std::__cxx11::string::operator+=(local_80,'\n');
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    this_local._7_1_ = mkvmuxer::Chapter::add_string(this_00,pcVar3,(char *)0x0,(char *)0x0);
    if (!this_local._7_1_) {
      printf("Unable to set chapter title\n");
    }
    std::__cxx11::string::~string(local_80);
  }
  return this_local._7_1_;
}

Assistant:

bool SampleMuxerMetadata::AddChapter(const cue_t& cue) {
  // TODO(matthewjheaney): support language and country

  mkvmuxer::Chapter* const chapter = segment_->AddChapter();

  if (chapter == NULL) {
    printf("Unable to add chapter\n");
    return false;
  }

  if (cue.identifier.empty()) {
    chapter->set_id(NULL);
  } else {
    const char* const id = cue.identifier.c_str();
    if (!chapter->set_id(id)) {
      printf("Unable to set chapter id\n");
      return false;
    }
  }

  typedef libwebvtt::presentation_t time_ms_t;
  const time_ms_t start_time_ms = cue.start_time.presentation();
  const time_ms_t stop_time_ms = cue.stop_time.presentation();

  enum { kNsPerMs = 1000000 };
  const uint64_t start_time_ns = start_time_ms * kNsPerMs;
  const uint64_t stop_time_ns = stop_time_ms * kNsPerMs;

  chapter->set_time(*segment_, start_time_ns, stop_time_ns);

  typedef libwebvtt::Cue::payload_t::const_iterator iter_t;
  iter_t i = cue.payload.begin();
  const iter_t j = cue.payload.end();

  std::string title;

  for (;;) {
    title += *i++;

    if (i == j)
      break;

    enum { kLF = '\x0A' };
    title += kLF;
  }

  if (!chapter->add_string(title.c_str(), NULL, NULL)) {
    printf("Unable to set chapter title\n");
    return false;
  }

  return true;
}